

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilesBoard.cpp
# Opt level: O1

QGroupBox * __thiscall TilesBoard::createGroupBox(TilesBoard *this)

{
  QVBoxLayout *this_00;
  QGroupBox *this_01;
  
  this_00 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_00);
  this->verticalLayout = this_00;
  (**(code **)(*(long *)this_00 + 0x68))(this_00);
  this_01 = (QGroupBox *)operator_new(0x28);
  QGroupBox::QGroupBox(this_01,(QWidget *)0x0);
  QWidget::setLayout((QLayout *)this_01);
  return this_01;
}

Assistant:

QGroupBox* TilesBoard::createGroupBox()
{
    verticalLayout = new QVBoxLayout();
    verticalLayout->setSpacing( 0 );
    QGroupBox* tilesBox = new QGroupBox();
    tilesBox->setLayout( verticalLayout );
    return tilesBox;
}